

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyReadCellOutputNum(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  Scl_Item_t *pPin;
  
  uVar1 = pCell->Child;
  iVar6 = p->nItems;
  if ((int)uVar1 < iVar6) {
    iVar5 = 0;
    if ((-1 < (int)uVar1) && (iVar5 = 0, p->pItems != (Scl_Item_t *)0x0)) {
      pPin = p->pItems + uVar1;
      iVar5 = 0;
      do {
        iVar3 = (pPin->Key).Beg;
        iVar2 = (pPin->Key).End - iVar3;
        iVar3 = strncmp(p->pContents + iVar3,"pin",(long)iVar2);
        if (iVar2 == 3 && iVar3 == 0) {
          pcVar4 = Scl_LibertyReadPinFormula(p,pPin);
          iVar5 = (iVar5 + 1) - (uint)(pcVar4 == (char *)0x0);
          iVar6 = p->nItems;
        }
        uVar1 = pPin->Next;
        if (iVar6 <= (int)uVar1) goto LAB_003d0036;
      } while ((-1 < (int)uVar1) && (pPin = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
    }
    return iVar5;
  }
LAB_003d0036:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadCellOutputNum( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        if ( Scl_LibertyReadPinFormula(p, pPin) )
            Counter++;
    return Counter;
}